

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.c
# Opt level: O0

ZyanStatus
ZydisEncoderDecodedInstructionToEncoderRequest
          (ZydisDecodedInstruction *instruction,ZydisDecodedOperand *operands,
          ZyanU8 operand_count_visible,ZydisEncoderRequest *request)

{
  ZydisEncoderOperand *pZVar1;
  ZyanU8 ZVar2;
  ZydisBranchType ZVar3;
  ZydisInstructionEncoding ZVar4;
  bool bVar5;
  ZydisBroadcastMode local_68;
  ZydisBroadcastMode local_60;
  ZydisEncoderOperand *enc_op;
  ZydisDecodedOperand *dec_op;
  ZyanU8 i;
  ZydisEncoderRequest *request_local;
  ZyanU8 operand_count_visible_local;
  ZydisDecodedOperand *operands_local;
  ZydisDecodedInstruction *instruction_local;
  
  if ((((instruction == (ZydisDecodedInstruction *)0x0) || (request == (ZydisEncoderRequest *)0x0))
      || ((operand_count_visible != '\0' && (operands == (ZydisDecodedOperand *)0x0)))) ||
     (operand_count_visible != instruction->operand_count_visible)) {
    instruction_local._4_4_ = 0x80100004;
  }
  else {
    memset(request,0,400);
    request->machine_mode = instruction->machine_mode;
    request->mnemonic = instruction->mnemonic;
    request->prefixes = instruction->attributes & 0x7fff8000000;
    request->branch_type = (instruction->meta).branch_type;
    if ((instruction->attributes & 0x4000000) == 0) {
      request->prefixes = request->prefixes & 0xfffff81fffffffff;
    }
    ZVar2 = instruction->address_width;
    if (ZVar2 == '\x10') {
      request->address_size_hint = ZYDIS_ADDRESS_SIZE_HINT_16;
    }
    else if (ZVar2 == ' ') {
      request->address_size_hint = ZYDIS_ADDRESS_SIZE_HINT_32;
    }
    else {
      if (ZVar2 != '@') {
        return 0x80100004;
      }
      request->address_size_hint = ZYDIS_ADDRESS_SIZE_HINT_64;
    }
    ZVar2 = instruction->operand_width;
    if (ZVar2 == '\b') {
      request->operand_size_hint = ZYDIS_OPERAND_SIZE_HINT_8;
    }
    else if (ZVar2 == '\x10') {
      request->operand_size_hint = ZYDIS_OPERAND_SIZE_HINT_16;
    }
    else if (ZVar2 == ' ') {
      request->operand_size_hint = ZYDIS_OPERAND_SIZE_HINT_32;
    }
    else {
      if (ZVar2 != '@') {
        return 0x80100004;
      }
      request->operand_size_hint = ZYDIS_OPERAND_SIZE_HINT_64;
    }
    ZVar3 = request->branch_type;
    if (ZVar3 == ZYDIS_BRANCH_TYPE_NONE) {
      request->branch_width = ZYDIS_BRANCH_WIDTH_NONE;
    }
    else if (ZVar3 == ZYDIS_BRANCH_TYPE_SHORT) {
      request->branch_width = ZYDIS_BRANCH_WIDTH_8;
    }
    else {
      if (1 < ZVar3 - ZYDIS_BRANCH_TYPE_NEAR) {
        return 0x80100004;
      }
      ZVar2 = instruction->operand_width;
      if (ZVar2 == '\x10') {
        request->branch_width = ZYDIS_BRANCH_WIDTH_16;
      }
      else if (ZVar2 == ' ') {
        request->branch_width = ZYDIS_BRANCH_WIDTH_32;
      }
      else {
        if (ZVar2 != '@') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0x1242,
                        "ZyanStatus ZydisEncoderDecodedInstructionToEncoderRequest(const ZydisDecodedInstruction *, const ZydisDecodedOperand *, ZyanU8, ZydisEncoderRequest *)"
                       );
        }
        request->branch_width = ZYDIS_BRANCH_WIDTH_64;
      }
    }
    ZVar4 = instruction->encoding;
    if (ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS < ZVar4) {
      if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_EVEX) {
        if ((instruction->avx).broadcast.is_static == '\0') {
          local_60 = (instruction->avx).broadcast.mode;
        }
        else {
          local_60 = ZYDIS_BROADCAST_MODE_INVALID;
        }
        (request->evex).broadcast = local_60;
        (request->evex).rounding = (instruction->avx).rounding.mode;
        (request->evex).sae = (instruction->avx).has_sae;
        if (((instruction->avx).mask.mode == ZYDIS_MASK_MODE_REQUIRED_BITS) ||
           (bVar5 = false, (instruction->avx).mask.mode == ZYDIS_MASK_MODE_CONTROL_ZEROING)) {
          bVar5 = (instruction->raw).field_3.xop.offset != '\0';
        }
        (request->evex).zeroing_mask = bVar5;
      }
      else {
        if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
          return 0x80100004;
        }
        if ((instruction->avx).broadcast.is_static == '\0') {
          local_68 = (instruction->avx).broadcast.mode;
        }
        else {
          local_68 = ZYDIS_BROADCAST_MODE_INVALID;
        }
        (request->mvex).broadcast = local_68;
        (request->mvex).conversion = (instruction->avx).conversion.mode;
        (request->mvex).rounding = (instruction->avx).rounding.mode;
        (request->mvex).swizzle = (instruction->avx).swizzle.mode;
        (request->mvex).sae = (instruction->avx).has_sae;
        (request->mvex).eviction_hint = (instruction->avx).has_eviction_hint;
      }
    }
    request->allowed_encodings = 1 << ((byte)instruction->encoding & 0x1f);
    request->operand_count = operand_count_visible;
    for (dec_op._7_1_ = 0; dec_op._7_1_ < operand_count_visible; dec_op._7_1_ = dec_op._7_1_ + 1) {
      pZVar1 = request->operands + dec_op._7_1_;
      pZVar1->type = *(ZydisOperandType *)
                      ((long)&operands->type + (ulong)((uint)dec_op._7_1_ * 0x50));
      switch(*(undefined4 *)((long)&operands->type + (ulong)((uint)dec_op._7_1_ * 0x50))) {
      case 1:
        (pZVar1->reg).value =
             *(ZydisRegister *)((long)&operands->field_10 + (ulong)((uint)dec_op._7_1_ * 0x50));
        (pZVar1->reg).is4 =
             *(int *)((long)&operands->encoding + (ulong)((uint)dec_op._7_1_ * 0x50)) == 5;
        break;
      case 2:
        (pZVar1->mem).base =
             *(ZydisRegister *)((long)&operands->field_10 + (ulong)((uint)dec_op._7_1_ * 0x50) + 8);
        (pZVar1->mem).index =
             *(ZydisRegister *)
              ((long)&operands->field_10 + (ulong)((uint)dec_op._7_1_ * 0x50) + 0xc);
        if (*(int *)((long)&operands->field_10 + (ulong)((uint)dec_op._7_1_ * 0x50)) == 3) {
          ZVar2 = '\0';
        }
        else {
          ZVar2 = *(ZyanU8 *)((long)&operands->field_10 + (ulong)((uint)dec_op._7_1_ * 0x50) + 0x10)
          ;
        }
        (pZVar1->mem).scale = ZVar2;
        if (*(char *)((long)&operands->field_10 + (ulong)((uint)dec_op._7_1_ * 0x50) + 0x21) != '\0'
           ) {
          (pZVar1->mem).displacement =
               *(ZyanI64 *)((long)&operands->field_10 + (ulong)((uint)dec_op._7_1_ * 0x50) + 0x18);
        }
        (pZVar1->mem).size =
             *(ushort *)((long)&operands->size + (ulong)((uint)dec_op._7_1_ * 0x50)) / 8;
        break;
      case 3:
        (pZVar1->ptr).segment =
             *(ZyanU16 *)((long)&operands->field_10 + (ulong)((uint)dec_op._7_1_ * 0x50));
        (pZVar1->ptr).offset =
             *(ZyanU32 *)((long)&operands->field_10 + (ulong)((uint)dec_op._7_1_ * 0x50) + 4);
        break;
      case 4:
        pZVar1->imm = *(ZydisEncoderOperandImm_ *)
                       ((long)&operands->field_10 + (ulong)((uint)dec_op._7_1_ * 0x50) + 8);
        if ((*(char *)((long)&operands->field_10 + (ulong)((uint)dec_op._7_1_ * 0x50) + 1) != '\0')
           && (instruction->mnemonic != ZYDIS_MNEMONIC_XBEGIN)) {
          ZVar2 = (instruction->raw).imm[0].size;
          if (ZVar2 == '\b') {
            request->branch_width = ZYDIS_BRANCH_WIDTH_8;
          }
          else if (ZVar2 == '\x10') {
            request->branch_width = ZYDIS_BRANCH_WIDTH_16;
          }
          else {
            if (ZVar2 != ' ') {
              return 0x80100004;
            }
            request->branch_width = ZYDIS_BRANCH_WIDTH_32;
          }
        }
        break;
      default:
        return 0x80100004;
      }
    }
    instruction_local._4_4_ = 0x100000;
  }
  return instruction_local._4_4_;
}

Assistant:

ZYDIS_EXPORT ZyanStatus ZydisEncoderDecodedInstructionToEncoderRequest(
        const ZydisDecodedInstruction *instruction, const ZydisDecodedOperand* operands,
        ZyanU8 operand_count_visible, ZydisEncoderRequest *request)
{
    if (!instruction || !request || (operand_count_visible && !operands) ||
        operand_count_visible != instruction->operand_count_visible)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZYAN_MEMSET(request, 0, sizeof(ZydisEncoderRequest));
    request->machine_mode = instruction->machine_mode;
    request->mnemonic = instruction->mnemonic;
    request->prefixes = instruction->attributes & ZYDIS_ENCODABLE_PREFIXES;
    request->branch_type = instruction->meta.branch_type;
    if (!(instruction->attributes & ZYDIS_ATTRIB_ACCEPTS_SEGMENT))
    {
        request->prefixes &= ~ZYDIS_ATTRIB_HAS_SEGMENT;
    }

    switch (instruction->address_width)
    {
    case 16:
        request->address_size_hint = ZYDIS_ADDRESS_SIZE_HINT_16;
        break;
    case 32:
        request->address_size_hint = ZYDIS_ADDRESS_SIZE_HINT_32;
        break;
    case 64:
        request->address_size_hint = ZYDIS_ADDRESS_SIZE_HINT_64;
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    switch (instruction->operand_width)
    {
    case 8:
        request->operand_size_hint = ZYDIS_OPERAND_SIZE_HINT_8;
        break;
    case 16:
        request->operand_size_hint = ZYDIS_OPERAND_SIZE_HINT_16;
        break;
    case 32:
        request->operand_size_hint = ZYDIS_OPERAND_SIZE_HINT_32;
        break;
    case 64:
        request->operand_size_hint = ZYDIS_OPERAND_SIZE_HINT_64;
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    switch (request->branch_type)
    {
    case ZYDIS_BRANCH_TYPE_NONE:
        request->branch_width = ZYDIS_BRANCH_WIDTH_NONE;
        break;
    case ZYDIS_BRANCH_TYPE_SHORT:
        request->branch_width = ZYDIS_BRANCH_WIDTH_8;
        break;
    case ZYDIS_BRANCH_TYPE_NEAR:
    case ZYDIS_BRANCH_TYPE_FAR:
        switch (instruction->operand_width)
        {
        case 16:
            request->branch_width = ZYDIS_BRANCH_WIDTH_16;
            break;
        case 32:
            request->branch_width = ZYDIS_BRANCH_WIDTH_32;
            break;
        case 64:
            request->branch_width = ZYDIS_BRANCH_WIDTH_64;
            break;
        default:
            ZYAN_UNREACHABLE;
        }
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    switch (instruction->encoding)
    {
    case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
    case ZYDIS_INSTRUCTION_ENCODING_3DNOW:
    case ZYDIS_INSTRUCTION_ENCODING_XOP:
    case ZYDIS_INSTRUCTION_ENCODING_VEX:
        break;
    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        request->evex.broadcast = !instruction->avx.broadcast.is_static ?
            instruction->avx.broadcast.mode : ZYDIS_BROADCAST_MODE_INVALID;
        request->evex.rounding = instruction->avx.rounding.mode;
        request->evex.sae = instruction->avx.has_sae;
        request->evex.zeroing_mask = (instruction->avx.mask.mode == ZYDIS_MASK_MODE_ZEROING ||
            instruction->avx.mask.mode == ZYDIS_MASK_MODE_CONTROL_ZEROING) &&
            (instruction->raw.evex.z) ? ZYAN_TRUE : ZYAN_FALSE;
        break;
    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
        request->mvex.broadcast = !instruction->avx.broadcast.is_static ?
            instruction->avx.broadcast.mode : ZYDIS_BROADCAST_MODE_INVALID;
        request->mvex.conversion = instruction->avx.conversion.mode;
        request->mvex.rounding = instruction->avx.rounding.mode;
        request->mvex.swizzle = instruction->avx.swizzle.mode;
        request->mvex.sae = instruction->avx.has_sae;
        request->mvex.eviction_hint = instruction->avx.has_eviction_hint;
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    request->allowed_encodings = 1 << instruction->encoding;

    request->operand_count = operand_count_visible;
    for (ZyanU8 i = 0; i < operand_count_visible; ++i)
    {
        const ZydisDecodedOperand *dec_op = &operands[i];
        ZydisEncoderOperand *enc_op = &request->operands[i];

        enc_op->type = dec_op->type;
        switch (dec_op->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            enc_op->reg.value = dec_op->reg.value;
            enc_op->reg.is4 = dec_op->encoding == ZYDIS_OPERAND_ENCODING_IS4;
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            enc_op->mem.base = dec_op->mem.base;
            enc_op->mem.index = dec_op->mem.index;
            enc_op->mem.scale = dec_op->mem.type != ZYDIS_MEMOP_TYPE_MIB ? dec_op->mem.scale : 0;
            if (dec_op->mem.disp.size)
            {
                enc_op->mem.displacement = dec_op->mem.disp.value;
            }
            enc_op->mem.size = dec_op->size / 8;
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            enc_op->ptr.segment = dec_op->ptr.segment;
            enc_op->ptr.offset = dec_op->ptr.offset;
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            enc_op->imm.u = dec_op->imm.value.u;
            // `XBEGIN` is an ISA-wide unique instruction because it's not a branching instruction
            // but it has a relative operand which behaves differently from all other relatives
            // (no truncating behavior in 16-bit mode). Encoder treats it as non-branching
            // instruction that scales with hidden operand size.
            if ((dec_op->imm.is_relative) &&
                (instruction->mnemonic != ZYDIS_MNEMONIC_XBEGIN))
            {
                switch (instruction->raw.imm->size)
                {
                case 8:
                    request->branch_width = ZYDIS_BRANCH_WIDTH_8;
                    break;
                case 16:
                    request->branch_width = ZYDIS_BRANCH_WIDTH_16;
                    break;
                case 32:
                    request->branch_width = ZYDIS_BRANCH_WIDTH_32;
                    break;
                default:
                    return ZYAN_STATUS_INVALID_ARGUMENT;
                }
            }
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    return ZYAN_STATUS_SUCCESS;
}